

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O1

void test_common<unsigned_short>(uint length,unsigned_short value)

{
  ulong uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  uint i;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  undefined8 *puVar6;
  shared_ptr<unsigned_short> pa;
  shared_ptr<unsigned_short> pb;
  
  uVar1 = (ulong)length;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar4 = (long)(int)(length + 1) * 2;
  }
  pvVar3 = operator_new__(uVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_short*,void(*)(unsigned_short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,pvVar3,
             nosimd::common::free<unsigned_short>);
  pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_short*,void(*)(unsigned_short*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<unsigned_short>);
  _Var2._M_pi = pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(undefined2 *)((long)pvVar3 + uVar1 * 2) = 0x7f;
  *(undefined2 *)
   ((long)&(pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar1 * 2) = 0x3f;
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      *(unsigned_short *)((long)pvVar3 + uVar4 * 2) = value;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (length != 0) {
    lVar5 = 0;
    do {
      if (*(unsigned_short *)((long)pvVar3 + lVar5 * 2) != value) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_common(unsigned int, T) [T = unsigned short]";
        *(undefined4 *)(puVar6 + 1) = 0x16;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      lVar5 = lVar5 + 1;
    } while (length != (uint)lVar5);
  }
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      *(undefined2 *)
       ((long)&(pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
               ->_vptr__Sp_counted_base + uVar4 * 2) = *(undefined2 *)((long)pvVar3 + uVar4 * 2);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (length != 0) {
    lVar5 = 0;
    do {
      if (*(unsigned_short *)
           ((long)&(pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + lVar5 * 2) != value) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_common(unsigned int, T) [T = unsigned short]";
        *(undefined4 *)(puVar6 + 1) = 0x1d;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      lVar5 = lVar5 + 1;
    } while (length != (uint)lVar5);
  }
  if (0 < (int)length) {
    memset(pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,0,
           (ulong)(length * 2));
  }
  if (length != 0) {
    lVar5 = 0;
    do {
      if (*(short *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + lVar5 * 2) != 0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_common(unsigned int, T) [T = unsigned short]";
        *(undefined4 *)(puVar6 + 1) = 0x24;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      lVar5 = lVar5 + 1;
    } while (length != (uint)lVar5);
    uVar4 = 0;
    do {
      *(short *)((long)pvVar3 + uVar4 * 2) = (short)uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      *(undefined2 *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + uVar4 * 2) =
           *(undefined2 *)((long)pvVar3 + uVar4 * 2);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (length != 0) {
    lVar5 = 0;
    do {
      if ((short)lVar5 != *(short *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + lVar5 * 2)) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_common(unsigned int, T) [T = unsigned short]";
        *(undefined4 *)(puVar6 + 1) = 0x2d;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      lVar5 = lVar5 + 1;
    } while (length != (uint)lVar5);
  }
  if ((*(short *)((long)pvVar3 + uVar1 * 2) == 0x7f) &&
     (*(short *)((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + uVar1 * 2) == 0x3f)) {
    if (pb.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar6 = "void test_common(unsigned int, T) [T = unsigned short]";
  *(undefined4 *)(puVar6 + 1) = 0x31;
  *(uint *)((long)puVar6 + 0xc) = length;
  __cxa_throw(puVar6,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}